

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O3

chunk * themed_gen(player *p,wchar_t min_height,wchar_t min_width,char **p_error)

{
  _Bool _Var1;
  chunk *c;
  loc_conflict centre;
  vault *v;
  
  c = (chunk *)cave_new((uint)z_info->dungeon_hgt,(uint)z_info->dungeon_wid);
  c->depth = (int)p->depth;
  c->place = (int)p->place;
  centre = loc((uint)(z_info->dungeon_wid >> 1),(uint)(z_info->dungeon_hgt >> 1));
  v = themed_level((uint)p->themed_level);
  _Var1 = build_vault(c,centre,v);
  if (_Var1) {
    draw_rectangle(c,L'\0',L'\0',c->height + L'\xffffffff',c->width + L'\xffffffff',FEAT_PERM,L'\0',
                   true);
    p->themed_level_appeared =
         p->themed_level_appeared | (ushort)(1L << (p->themed_level - 1 & 0x3f));
  }
  else {
    player->themed_level = '\0';
    *p_error = "not a themed level";
    c = (chunk *)0x0;
  }
  return c;
}

Assistant:

struct chunk *themed_gen(struct player *p, int min_height, int min_width,
						 const char **p_error)
{
	struct chunk *c = cave_new(z_info->dungeon_hgt, z_info->dungeon_wid);
	c->depth = p->depth;
	c->place = p->place;

	/* Build the themed level. */
	if (!build_vault(c, loc(z_info->dungeon_wid / 2, z_info->dungeon_hgt / 2),
					 themed_level(p->themed_level))) {
		/* Oops.  We're /not/ on a themed level. */
		player->themed_level = 0;
		*p_error = "not a themed level";
		return NULL;
	}

	/* Bound with perma-rock */
	draw_rectangle(c, 0, 0, c->height - 1, c->width - 1, FEAT_PERM,
				   SQUARE_NONE, true);

	/* Indicate that this theme is built, and should not appear again. */
	p->themed_level_appeared |= (1L << (p->themed_level - 1));

	return c;
}